

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fork_detect.cc
# Opt level: O3

uint64_t CRYPTO_get_fork_generation(void)

{
  CRYPTO_atomic_u32 *pCVar1;
  uint64_t uVar2;
  
  CRYPTO_once(&g_fork_detect_once,init_fork_detect);
  pCVar1 = g_fork_detect_addr;
  if (g_fork_detect_addr == (CRYPTO_atomic_u32 *)0x0) {
    uVar2 = 0x2a;
    if (g_force_madv_wipeonfork_enabled == 0) {
      uVar2 = 0;
    }
    if (g_force_madv_wipeonfork == '\0') {
      uVar2 = 0;
    }
  }
  else {
    uVar2 = g_fork_generation;
    if ((g_fork_detect_addr->super___atomic_base<unsigned_int>)._M_i == 0) {
      CRYPTO_MUTEX_lock_write(&g_fork_detect_lock);
      uVar2 = g_fork_generation;
      if ((pCVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
        uVar2 = g_fork_generation + 1 + (ulong)(g_fork_generation == 0xffffffffffffffff);
        LOCK();
        g_fork_generation = uVar2;
        (pCVar1->super___atomic_base<unsigned_int>)._M_i = 1;
        UNLOCK();
      }
      CRYPTO_MUTEX_unlock_write(&g_fork_detect_lock);
    }
  }
  return uVar2;
}

Assistant:

uint64_t CRYPTO_get_fork_generation(void) {
  CRYPTO_once(&g_fork_detect_once, init_fork_detect);

  // In a single-threaded process, there are obviously no races because there's
  // only a single mutator in the address space.
  //
  // In a multi-threaded environment, |CRYPTO_once| ensures that the flag byte
  // is initialised atomically, even if multiple threads enter this function
  // concurrently.
  //
  // Additionally, while the kernel will only clear WIPEONFORK at a point when a
  // child process is single-threaded, the child may become multi-threaded
  // before it observes this. Therefore, we must synchronize the logic below.

  CRYPTO_atomic_u32 *const flag_ptr = g_fork_detect_addr;
  if (flag_ptr == NULL) {
    // Our kernel is too old to support |MADV_WIPEONFORK| or
    // |g_force_madv_wipeonfork| is set.
    if (g_force_madv_wipeonfork && g_force_madv_wipeonfork_enabled) {
      // A constant generation number to simulate support, even if the kernel
      // doesn't support it.
      return 42;
    }
    // With Linux and clone(), we do not believe that pthread_atfork() is
    // sufficient for detecting all forms of address space duplication. At this
    // point we have a kernel that does not support MADV_WIPEONFORK. We could
    // return the generation number from pthread_atfork() here and it would
    // probably be safe in almost any situation, but to ensure safety we return
    // 0 and force an entropy draw on every call.
    return 0;
  }

  // In the common case, try to observe the flag without taking a lock. This
  // avoids cacheline contention in the PRNG.
  uint64_t *const generation_ptr = &g_fork_generation;
  if (CRYPTO_atomic_load_u32(flag_ptr) != 0) {
    // If we observe a non-zero flag, it is safe to read |generation_ptr|
    // without a lock. The flag and generation number are fixed for this copy of
    // the address space.
    return *generation_ptr;
  }

  // The flag was zero. The generation number must be incremented, but other
  // threads may have concurrently observed the zero, so take a lock before
  // incrementing.
  CRYPTO_MUTEX *const lock = &g_fork_detect_lock;
  CRYPTO_MUTEX_lock_write(lock);
  uint64_t current_generation = *generation_ptr;
  if (CRYPTO_atomic_load_u32(flag_ptr) == 0) {
    // A fork has occurred.
    current_generation++;
    if (current_generation == 0) {
      // Zero means fork detection isn't supported, so skip that value.
      current_generation = 1;
    }

    // We must update |generation_ptr| before |flag_ptr|. Other threads may
    // observe |flag_ptr| without taking a lock.
    *generation_ptr = current_generation;
    CRYPTO_atomic_store_u32(flag_ptr, 1);
  }
  CRYPTO_MUTEX_unlock_write(lock);

  return current_generation;
}